

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feebumper.cpp
# Opt level: O1

bool wallet::feebumper::TransactionCanBeBumped(CWallet *wallet,uint256 *txid)

{
  Result RVar1;
  CWalletTx *wtx;
  long in_FS_OFFSET;
  bool bVar2;
  vector<bilingual_str,_std::allocator<bilingual_str>_> errors_dummy;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  vector<bilingual_str,_std::allocator<bilingual_str>_> local_48;
  unique_lock<std::recursive_mutex> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28._M_device = &(wallet->cs_wallet).super_recursive_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_28);
  wtx = CWallet::GetWalletTx(wallet,txid);
  if (wtx == (CWalletTx *)0x0) {
    bVar2 = false;
  }
  else {
    local_48.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<bilingual_str,_std::allocator<bilingual_str>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    RVar1 = PreconditionChecks(wallet,wtx,true,&local_48);
    bVar2 = RVar1 == OK;
    std::vector<bilingual_str,_std::allocator<bilingual_str>_>::~vector(&local_48);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool TransactionCanBeBumped(const CWallet& wallet, const uint256& txid)
{
    LOCK(wallet.cs_wallet);
    const CWalletTx* wtx = wallet.GetWalletTx(txid);
    if (wtx == nullptr) return false;

    std::vector<bilingual_str> errors_dummy;
    feebumper::Result res = PreconditionChecks(wallet, *wtx, /* require_mine=*/ true, errors_dummy);
    return res == feebumper::Result::OK;
}